

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__jpg_DCT(float *d0p,float *d1p,float *d2p,float *d3p,float *d4p,float *d5p,float *d6p,
                   float *d7p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float tmp12;
  float tmp11;
  float tmp13;
  float tmp10;
  float tmp4;
  float tmp3;
  float tmp5;
  float tmp2;
  float tmp6;
  float tmp1;
  float tmp7;
  float tmp0;
  float z13;
  float z11;
  float z5;
  float z4;
  float z3;
  float z2;
  float z1;
  float d7;
  float d6;
  float d5;
  float d4;
  float d3;
  float d2;
  float d1;
  float d0;
  float *d5p_local;
  float *d4p_local;
  float *d3p_local;
  float *d2p_local;
  float *d1p_local;
  float *d0p_local;
  
  fVar1 = *d0p + *d7p;
  fVar2 = *d0p - *d7p;
  fVar3 = *d1p + *d6p;
  fVar4 = *d1p - *d6p;
  fVar5 = *d2p + *d5p;
  fVar6 = *d2p - *d5p;
  fVar7 = *d3p + *d4p;
  fVar8 = fVar1 + fVar7;
  fVar1 = fVar1 - fVar7;
  fVar7 = fVar3 + fVar5;
  fVar3 = ((fVar3 - fVar5) + fVar1) * 0.70710677;
  fVar5 = (*d3p - *d4p) + fVar6;
  fVar9 = fVar4 + fVar2;
  fVar10 = (fVar5 - fVar9) * 0.38268343;
  fVar5 = fVar5 * 0.5411961 + fVar10;
  fVar10 = fVar9 * 1.306563 + fVar10;
  fVar4 = (fVar6 + fVar4) * 0.70710677;
  fVar6 = fVar2 + fVar4;
  fVar2 = fVar2 - fVar4;
  *d5p = fVar2 + fVar5;
  *d3p = fVar2 - fVar5;
  *d1p = fVar6 + fVar10;
  *d7p = fVar6 - fVar10;
  *d0p = fVar8 + fVar7;
  *d2p = fVar1 + fVar3;
  *d4p = fVar8 - fVar7;
  *d6p = fVar1 - fVar3;
  return;
}

Assistant:

static void stbiw__jpg_DCT(float *d0p, float *d1p, float *d2p, float *d3p, float *d4p, float *d5p, float *d6p, float *d7p) {
   float d0 = *d0p, d1 = *d1p, d2 = *d2p, d3 = *d3p, d4 = *d4p, d5 = *d5p, d6 = *d6p, d7 = *d7p;
   float z1, z2, z3, z4, z5, z11, z13;

   float tmp0 = d0 + d7;
   float tmp7 = d0 - d7;
   float tmp1 = d1 + d6;
   float tmp6 = d1 - d6;
   float tmp2 = d2 + d5;
   float tmp5 = d2 - d5;
   float tmp3 = d3 + d4;
   float tmp4 = d3 - d4;

   // Even part
   float tmp10 = tmp0 + tmp3;   // phase 2
   float tmp13 = tmp0 - tmp3;
   float tmp11 = tmp1 + tmp2;
   float tmp12 = tmp1 - tmp2;

   d0 = tmp10 + tmp11;       // phase 3
   d4 = tmp10 - tmp11;

   z1 = (tmp12 + tmp13) * 0.707106781f; // c4
   d2 = tmp13 + z1;       // phase 5
   d6 = tmp13 - z1;

   // Odd part
   tmp10 = tmp4 + tmp5;       // phase 2
   tmp11 = tmp5 + tmp6;
   tmp12 = tmp6 + tmp7;

   // The rotator is modified from fig 4-8 to avoid extra negations.
   z5 = (tmp10 - tmp12) * 0.382683433f; // c6
   z2 = tmp10 * 0.541196100f + z5; // c2-c6
   z4 = tmp12 * 1.306562965f + z5; // c2+c6
   z3 = tmp11 * 0.707106781f; // c4

   z11 = tmp7 + z3;      // phase 5
   z13 = tmp7 - z3;

   *d5p = z13 + z2;         // phase 6
   *d3p = z13 - z2;
   *d1p = z11 + z4;
   *d7p = z11 - z4;

   *d0p = d0;  *d2p = d2;  *d4p = d4;  *d6p = d6;
}